

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void __thiscall amrex::VisMF::clear(VisMF *this,int fabIndex,int compIndex)

{
  FArrayBox **ppFVar1;
  Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffd8);
  ppFVar1 = Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::operator[]
                      (in_RDI,in_stack_ffffffffffffffd8);
  if (*ppFVar1 != (FArrayBox *)0x0) {
    (*((*ppFVar1)->super_BaseFab<double>)._vptr_BaseFab[1])();
  }
  Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>,_std::allocator<amrex::Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffd8);
  ppFVar1 = Vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>::operator[]
                      (in_RDI,in_stack_ffffffffffffffd8);
  *ppFVar1 = (FArrayBox *)0x0;
  return;
}

Assistant:

void
VisMF::clear (int fabIndex,
              int compIndex)
{
    delete m_pa[compIndex][fabIndex];
    m_pa[compIndex][fabIndex] = 0;
}